

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::FunctionCallStmt::FunctionCallStmt
          (FunctionCallStmt *this,shared_ptr<kratos::FunctionStmtBlock> *func,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *args)

{
  element_type *peVar1;
  Generator *this_00;
  int iVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  VarException *pVVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  undefined1 local_78 [32];
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  undefined1 local_40 [16];
  
  Stmt::Stmt(&this->super_Stmt,FunctionalCall);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002a6df8;
  std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->func_).
              super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>,
             &func->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>);
  (this->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_c8,
             &(((func->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->ports_)._M_t);
  p_Var6 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_40._0_8_ = this;
  while( true ) {
    if (p_Var6 == (_Rb_tree_node_base *)&ports) {
      peVar1 = (func->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = peVar1->parent_;
      std::__cxx11::string::string((string *)local_78,(string *)&peVar1->function_name_);
      Generator::call(this_00,(string *)local_78,args,false);
      std::__cxx11::string::~string((string *)local_78);
      Var::as<kratos::FunctionCallVar>((Var *)local_78);
      std::__shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->var_).
                  super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2> *)local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                   *)local_c8);
      return;
    }
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
            ::find(&args->_M_t,(key_type *)(p_Var6 + 1));
    if ((_Rb_tree_header *)cVar4._M_node == &(args->_M_t)._M_impl.super__Rb_tree_header) {
      pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 1);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6[1]._M_parent;
      bVar8 = fmt::v7::to_string_view<char,_0>("{0} is not connected");
      format_str.data_ = (char *)bVar8.size_;
      format_str.size_ = 0xd;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_78,(detail *)bVar8.data_,format_str,args_00);
      ports._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var6 + 2);
      __l._M_len = 1;
      __l._M_array = (iterator)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l,(allocator_type *)(local_40 + 0xf));
      VarException::VarException(pVVar7,(string *)local_78,&local_58);
      __cxa_throw(pVVar7,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::at(args,(key_type *)(p_Var6 + 1));
    iVar2 = (**(code **)(**(long **)(p_Var6 + 2) + 0x38))();
    iVar3 = (*(((pmVar5->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    if (iVar2 != iVar3) {
      pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 1);
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6[1]._M_parent;
      bVar8 = fmt::v7::to_string_view<char,_0>("{0}\'s width doesn\'t match");
      format_str_01.data_ = (char *)bVar8.size_;
      format_str_01.size_ = 0xd;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_78,(detail *)bVar8.data_,format_str_01,args_02);
      ports._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var6 + 2);
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_58,__l_01,(allocator_type *)(local_40 + 0xf));
      VarException::VarException(pVVar7,(string *)local_78,&local_58);
      __cxa_throw(pVVar7,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((bool)*(char *)(*(long *)(p_Var6 + 2) + 0xf0) !=
        ((pmVar5->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->is_signed_)
    break;
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  }
  pVVar7 = (VarException *)__cxa_allocate_exception(0x10);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 1);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6[1]._M_parent;
  bVar8 = fmt::v7::to_string_view<char,_0>("{0}\'s sign doesn\'t match");
  format_str_00.data_ = (char *)bVar8.size_;
  format_str_00.size_ = 0xd;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_78,(detail *)bVar8.data_,format_str_00,args_01);
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var6 + 2);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_58,__l_00,(allocator_type *)(local_40 + 0xf));
  VarException::VarException(pVVar7,(string *)local_78,&local_58);
  __cxa_throw(pVVar7,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FunctionCallStmt::FunctionCallStmt(const std::shared_ptr<FunctionStmtBlock> &func,
                                   const std::map<std::string, std::shared_ptr<Var>> &args)
    : Stmt(StatementType::FunctionalCall), func_(func) {
    // check the function call types
    auto ports = func->ports();
    for (auto const &[port_name, func_port] : ports) {
        if (args.find(port_name) == args.end()) {
            throw VarException(::format("{0} is not connected", port_name), {func_port.get()});
        }
        // check the port types
        const auto &arg_port = args.at(port_name);
        if (func_port->width() != arg_port->width())
            throw VarException(::format("{0}'s width doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
        if (func_port->is_signed() != arg_port->is_signed())
            throw VarException(::format("{0}'s sign doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
    }
    auto *generator = func->generator();
    auto &p = generator->call(func->function_name(), args, false);
    var_ = p.as<FunctionCallVar>();
}